

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * __thiscall
pbrt::Image::FloatResizeUp
          (Image *__return_storage_ptr__,Image *this,Point2i newRes,WrapMode2D wrapMode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  void *pvVar3;
  pointer pRVar4;
  Allocator alloc;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  function<void_(pbrt::Bounds2<int>)> *func;
  char *args;
  char *args_1;
  uint newRes_00;
  uint newRes_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> local_c8;
  int vb;
  undefined4 uStack_a4;
  pointer pRStack_a0;
  pointer local_98;
  int va;
  undefined4 uStack_84;
  pointer pRStack_80;
  pointer local_78;
  Image *local_70;
  ColorEncodingHandle local_68;
  WrapMode2D wrapMode_local;
  Bounds2i local_58;
  code *pcStack_48;
  code *pcStack_40;
  
  newRes_01 = newRes.super_Tuple2<pbrt::Point2,_int>.x;
  _va = (pointer)CONCAT44(uStack_84,newRes_01);
  iVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  _vb = (pointer)CONCAT44(uStack_a4,iVar6);
  local_70 = __return_storage_ptr__;
  wrapMode_local = wrapMode;
  if ((int)newRes_01 < iVar6) {
    args_1 = "resolution.x";
    args = "newRes.x";
    iVar6 = 0x10b;
  }
  else {
    newRes_00 = newRes.super_Tuple2<pbrt::Point2,_int>.y;
    _va = (pointer)CONCAT44(uStack_84,newRes_00);
    iVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
    _vb = (pointer)CONCAT44(uStack_a4,iVar6);
    if (iVar6 <= (int)newRes_00) {
      pbVar1 = (this->channelNames).ptr;
      sVar2 = (this->channelNames).nStored;
      local_68.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = sVar2;
      channels.ptr = pbVar1;
      Image(local_70,Float,newRes,channels,&local_68,alloc);
      local_78 = (pointer)0x0;
      _va = (pointer)0x0;
      pRStack_80 = (pointer)0x0;
      local_98 = (pointer)0x0;
      _vb = (pointer)0x0;
      pRStack_a0 = (pointer)0x0;
      ResampleWeights(&local_c8,(this->resolution).super_Tuple2<pbrt::Point2,_int>.x,newRes_01);
      pRVar4 = local_78;
      pvVar3 = _va;
      local_78 = local_c8.
                 super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      _va = local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pRStack_80 = local_c8.
                   super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
      local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)pRVar4 - (long)pvVar3);
      }
      if (local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ResampleWeights(&local_c8,(this->resolution).super_Tuple2<pbrt::Point2,_int>.y,newRes_00);
      pRVar4 = local_98;
      pvVar3 = _vb;
      local_98 = local_c8.
                 super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      _vb = local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pRStack_a0 = local_c8.
                   super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
      local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)pRVar4 - (long)pvVar3);
      }
      if (local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = (int)newRes_00 >> 0x1f & newRes_00;
      local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = (int)newRes_01 >> 0x1f & newRes_01;
      uVar5 = 0;
      uVar7 = 0;
      if (0 < (int)newRes_01) {
        uVar7 = (ulong)newRes.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
      }
      if (newRes_00 != 0 && -1 < (long)newRes.super_Tuple2<pbrt::Point2,_int>) {
        uVar5 = (ulong)newRes_00;
      }
      local_c8.super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar7 | uVar5 << 0x20);
      local_58.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
      local_58.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
      local_58.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
      local_58.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
      pcStack_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)operator_new(0x28);
      *(int **)local_58.pMin.super_Tuple2<pbrt::Point2,_int> = &va;
      *(int **)((long)local_58.pMin.super_Tuple2<pbrt::Point2,_int> + 8) = &vb;
      *(Image **)((long)local_58.pMin.super_Tuple2<pbrt::Point2,_int> + 0x10) = this;
      *(WrapMode2D **)((long)local_58.pMin.super_Tuple2<pbrt::Point2,_int> + 0x18) = &wrapMode_local
      ;
      *(Image **)((long)local_58.pMin.super_Tuple2<pbrt::Point2,_int> + 0x20) = local_70;
      pcStack_40 = std::
                   _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
                   ::_M_invoke;
      pcStack_48 = std::
                   _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:276:45)>
                   ::_M_manager;
      ParallelFor2D((pbrt *)&local_c8,&local_58,func);
      if (pcStack_48 != (code *)0x0) {
        (*pcStack_48)(&local_58,&local_58,3);
      }
      if (_vb != (pointer)0x0) {
        operator_delete(_vb,(long)local_98 - (long)_vb);
      }
      if (_va != (pointer)0x0) {
        operator_delete(_va,(long)local_78 - (long)_va);
      }
      return local_70;
    }
    args_1 = "resolution.y";
    args = "newRes.y";
    iVar6 = 0x10c;
  }
  LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],int&,char_const(&)[13],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,iVar6,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [9])args,
             (char (*) [13])args_1,(char (*) [9])args,&va,(char (*) [13])args_1,&vb);
}

Assistant:

Image Image::FloatResizeUp(Point2i newRes, WrapMode2D wrapMode) const {
    CHECK_GE(newRes.x, resolution.x);
    CHECK_GE(newRes.y, resolution.y);
    Image resampledImage(PixelFormat::Float, newRes, channelNames);
    // Compute $x$ and $y$ resampling weights for image resizing
    std::vector<ResampleWeight> xWeights, yWeights;
    xWeights = ResampleWeights(resolution[0], newRes[0]);
    yWeights = ResampleWeights(resolution[1], newRes[1]);

    // Resize image in parallel, working by tiles
    ParallelFor2D(Bounds2i({0, 0}, newRes), [&](Bounds2i outExtent) {
        // Determine extent in source image and copy pixel values to _inBuf_
        Bounds2i inExtent(Point2i(xWeights[outExtent.pMin.x].firstPixel,
                                  yWeights[outExtent.pMin.y].firstPixel),
                          Point2i(xWeights[outExtent.pMax.x - 1].firstPixel + 4,
                                  yWeights[outExtent.pMax.y - 1].firstPixel + 4));
        std::vector<float> inBuf(NChannels() * inExtent.Area());
        CopyRectOut(inExtent, pstd::span<float>(inBuf), wrapMode);

        // Resize image in the $x$ dimension
        // Compute image extents and allocate _xBuf_
        int nxOut = outExtent.pMax.x - outExtent.pMin.x;
        int nyOut = outExtent.pMax.y - outExtent.pMin.y;
        int nxIn = inExtent.pMax.x - inExtent.pMin.x;
        int nyIn = inExtent.pMax.y - inExtent.pMin.y;
        std::vector<float> xBuf(NChannels() * nyIn * nxOut);

        int xBufOffset = 0;
        for (int yOut = inExtent.pMin.y; yOut < inExtent.pMax.y; ++yOut) {
            for (int xOut = outExtent.pMin.x; xOut < outExtent.pMax.x; ++xOut) {
                // Resample image pixel _(xOut, yOut)_
                DCHECK(xOut >= 0 && xOut < xWeights.size());
                const ResampleWeight &rsw = xWeights[xOut];
                // Compute _inOffset_ into _inBuf_ for _(xOut, yOut)_
                // w.r.t. inBuf
                int xIn = rsw.firstPixel - inExtent.pMin.x;
                DCHECK_GE(xIn, 0);
                DCHECK_LT(xIn + 3, nxIn);
                int yIn = yOut - inExtent.pMin.y;
                int inOffset = NChannels() * (xIn + yIn * nxIn);
                DCHECK_GE(inOffset, 0);
                DCHECK_LT(inOffset + 3 * NChannels(), inBuf.size());

                for (int c = 0; c < NChannels(); ++c, ++xBufOffset, ++inOffset)
                    xBuf[xBufOffset] = rsw.weight[0] * inBuf[inOffset] +
                                       rsw.weight[1] * inBuf[inOffset + NChannels()] +
                                       rsw.weight[2] * inBuf[inOffset + 2 * NChannels()] +
                                       rsw.weight[3] * inBuf[inOffset + 3 * NChannels()];
            }
        }

        // Resize image in the $y$ dimension
        std::vector<float> outBuf(NChannels() * nxOut * nyOut);
        for (int x = 0; x < nxOut; ++x) {
            for (int y = 0; y < nyOut; ++y) {
                int yOut = y + outExtent[0][1];
                DCHECK(yOut >= 0 && yOut < yWeights.size());
                const ResampleWeight &rsw = yWeights[yOut];

                DCHECK_GE(rsw.firstPixel - inExtent[0][1], 0);
                int xBufOffset =
                    NChannels() * (x + nxOut * (rsw.firstPixel - inExtent[0][1]));
                DCHECK_GE(xBufOffset, 0);
                int step = NChannels() * nxOut;
                DCHECK_LT(xBufOffset + 3 * step, xBuf.size());

                int outOffset = NChannels() * (x + y * nxOut);
                for (int c = 0; c < NChannels(); ++c, ++outOffset, ++xBufOffset)
                    outBuf[outOffset] =
                        std::max<Float>(0, (rsw.weight[0] * xBuf[xBufOffset] +
                                            rsw.weight[1] * xBuf[xBufOffset + step] +
                                            rsw.weight[2] * xBuf[xBufOffset + 2 * step] +
                                            rsw.weight[3] * xBuf[xBufOffset + 3 * step]));
            }
        }

        // Copy resampled image pixels out into _resampledImage_
        resampledImage.CopyRectIn(outExtent, outBuf);
    });

    return resampledImage;
}